

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O0

void __thiscall n_e_s::nes::Nes::Nes(Nes *this)

{
  pointer registers;
  pointer pIVar1;
  pointer pCVar2;
  pointer ppu;
  Nes *this_local;
  
  core::MmuFactory::create_empty();
  std::make_unique<n_e_s::core::PpuRegisters>();
  registers = std::
              unique_ptr<n_e_s::core::PpuRegisters,_std::default_delete<n_e_s::core::PpuRegisters>_>
              ::get(&this->ppu_registers_);
  pIVar1 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::get
                     (&this->ppu_mmu_);
  core::PpuFactory::create((PpuFactory *)&this->ppu_,registers,pIVar1);
  core::MmuFactory::create_empty();
  std::make_unique<n_e_s::core::CpuRegisters>();
  pCVar2 = std::
           unique_ptr<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>::
           get(&this->cpu_registers_);
  pIVar1 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::get
                     (&this->mmu_);
  ppu = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::get
                  (&this->ppu_);
  core::CpuFactory::create_mos6502((CpuFactory *)&this->cpu_,pCVar2,pIVar1,ppu);
  std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>::
  unique_ptr<std::default_delete<n_e_s::core::IRom>,void>
            ((unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>> *)&this->rom_);
  core::NesControllerFactory::create_nes_controller();
  core::NesControllerFactory::create_nes_controller();
  this->cycle_ = 0;
  pCVar2 = std::
           unique_ptr<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>::
           operator->(&this->cpu_registers_);
  pCVar2->p = '$';
  pCVar2 = std::
           unique_ptr<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>::
           operator->(&this->cpu_registers_);
  pCVar2->y = '\0';
  pCVar2 = std::
           unique_ptr<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>::
           operator->(&this->cpu_registers_);
  pCVar2->x = '\0';
  pCVar2 = std::
           unique_ptr<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>::
           operator->(&this->cpu_registers_);
  pCVar2->a = '\0';
  pCVar2 = std::
           unique_ptr<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>::
           operator->(&this->cpu_registers_);
  pCVar2->sp = 0xfd;
  return;
}

Assistant:

Nes::Nes()
        : ppu_mmu_(MmuFactory::create_empty()),
          ppu_registers_(std::make_unique<n_e_s::core::PpuRegisters>()),
          ppu_(PpuFactory::create(ppu_registers_.get(), ppu_mmu_.get())),
          mmu_(MmuFactory::create_empty()),
          cpu_registers_(std::make_unique<n_e_s::core::CpuRegisters>()),
          cpu_(CpuFactory::create_mos6502(cpu_registers_.get(),
                  mmu_.get(),
                  ppu_.get())),
          controller1_(NesControllerFactory::create_nes_controller()),
          controller2_(NesControllerFactory::create_nes_controller()) {
    // P should be set to 0x34 according to the information here:
    // https://wiki.nesdev.com/w/index.php/CPU_power_up_state
    // However, nestest sets p to 0x24 instead. We do that for now as well.
    cpu_registers_->p = I_FLAG | FLAG_5;
    cpu_registers_->a = cpu_registers_->x = cpu_registers_->y = 0x00;
    cpu_registers_->sp = 0xFD;
}